

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O2

void __thiscall
ConfidentialTransaction_SizeTest_Test::TestBody(ConfidentialTransaction_SizeTest_Test *this)

{
  uint32_t uVar1;
  char *pcVar2;
  Amount AVar3;
  Amount local_f8;
  AssertHelper local_e8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialAssetId asset;
  ConfidentialTransaction tx;
  ConfidentialTransaction empty_tx;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&empty_tx,2,0);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx);
  cfd::core::ConfidentialTransaction::operator=(&tx,&empty_tx);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&asset,&tx.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0200000000000000000000\"","tx.GetHex().c_str()",
             "0200000000000000000000",
             (char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                              (char)asset._vptr_ConfidentialAssetId));
  std::__cxx11::string::~string((string *)&asset);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xef,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetTotalSize(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"11","tx.GetTotalSize()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetVsize(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"11","tx.GetVsize()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetWeight(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"44","tx.GetWeight()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&tx,&exp_txid,2,0xfffffffe,(Script *)cfd::core::Script::Empty);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&asset,&tx.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000\""
             ,"tx.GetHex().c_str()",
             "020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000"
             ,(char *)CONCAT71(asset._vptr_ConfidentialAssetId._1_7_,
                               (char)asset._vptr_ConfidentialAssetId));
  std::__cxx11::string::~string((string *)&asset);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&asset);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&asset);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&asset);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetTotalSize(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"52","tx.GetTotalSize()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetVsize(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"52","tx.GetVsize()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0;
  uVar1 = cfd::core::ConfidentialTransaction::GetWeight(&tx);
  local_f8.amount_ = CONCAT44(local_f8.amount_._4_4_,uVar1);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&asset,"208","tx.GetWeight()",(int *)&gtest_ar,(uint *)&local_f8);
  if ((char)asset._vptr_ConfidentialAssetId == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)asset.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&asset.data_);
  cfd::core::ConfidentialTransaction::operator=(&tx,&empty_tx);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_f8.amount_ = AVar3.amount_;
  local_f8.ignore_check_ = AVar3.ignore_check_;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&asset,&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTransaction::AddTxOut(&tx,&local_f8,&asset,&exp_locking_script);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&gtest_ar,&tx.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_8,
             "\"0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000\""
             ,"tx.GetHex().c_str()",
             "0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000"
             ,(char *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_8.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_8.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_3_ = 0;
  local_e8.data_._0_4_ = cfd::core::ConfidentialTransaction::GetTotalSize(&tx);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"80","tx.GetTotalSize()",(int *)&gtest_ar_8,(uint *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_3_ = 0;
  local_e8.data_._0_4_ = cfd::core::ConfidentialTransaction::GetVsize(&tx);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"80","tx.GetVsize()",(int *)&gtest_ar_8,(uint *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_8.success_ = true;
  gtest_ar_8._1_3_ = 1;
  local_e8.data_._0_4_ = cfd::core::ConfidentialTransaction::GetWeight(&tx);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&gtest_ar,"320","tx.GetWeight()",(int *)&gtest_ar_8,(uint *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x102,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&gtest_ar_8);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&asset);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&empty_tx);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SizeTest) {
  ConfidentialTransaction empty_tx(2, 0);
  ConfidentialTransaction tx;
  tx = empty_tx;
  EXPECT_STREQ("0200000000000000000000", tx.GetHex().c_str());
  EXPECT_EQ(11, tx.GetTotalSize());
  EXPECT_EQ(11, tx.GetVsize());
  EXPECT_EQ(44, tx.GetWeight());

  tx.AddTxIn(exp_txid, exp_index, exp_sequence);
  EXPECT_STREQ("020000000001319bff5f4311e6255ecf4dd472650a6ef85fde7d11cd10d3e6ba5974174aeb560200000000feffffff0000000000", tx.GetHex().c_str());
  EXPECT_EQ(52, tx.GetTotalSize());
  EXPECT_EQ(52, tx.GetVsize());
  EXPECT_EQ(208, tx.GetWeight());

  tx = empty_tx;
  int64_t exp_satoshi = 12345678;
  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  tx.AddTxOut(amt, asset, exp_locking_script);
  EXPECT_STREQ("0200000000000101f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000000bc614e001976a9146a98a3f2935718df72518c00768ec67c589e0b2888ac00000000", tx.GetHex().c_str());
  EXPECT_EQ(80, tx.GetTotalSize());
  EXPECT_EQ(80, tx.GetVsize());
  EXPECT_EQ(320, tx.GetWeight());
}